

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UChar * icu_63::UCharsTrie::findUniqueValueFromBranch
                  (UChar *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  UChar UVar1;
  bool bVar2;
  UBool UVar3;
  uint uVar4;
  UChar *pUVar5;
  UBool UVar6;
  uint uVar7;
  UChar *pUVar8;
  int iVar9;
  
  if (5 < length) {
    do {
      UVar1 = pos[1];
      uVar4 = (uint)(ushort)UVar1;
      pUVar5 = pos + 2;
      if (0xfbff < (ushort)UVar1) {
        if (UVar1 == L'\xffff') {
          uVar4 = CONCAT22(pos[2],pos[3]);
          pUVar5 = pos + 4;
        }
        else {
          uVar4 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)pos[2] + 0x4000000;
          pUVar5 = pos + 3;
        }
      }
      pUVar5 = findUniqueValueFromBranch
                         (pUVar5 + (int)uVar4,(uint)length >> 1,haveUniqueValue,uniqueValue);
      if (pUVar5 == (UChar *)0x0) {
        return (UChar *)0x0;
      }
      pUVar5 = pos + 2;
      if (0xfbff < (ushort)pos[1]) {
        if (pos[1] == L'\xffff') {
          pUVar5 = pos + 4;
        }
        else {
          pUVar5 = pos + 3;
        }
      }
      pos = pUVar5;
      length = length - ((uint)length >> 1);
    } while (5 < length);
  }
  iVar9 = length + 1;
  do {
    pUVar5 = pos + 2;
    uVar7 = (ushort)pos[1] & 0x7fff;
    uVar4 = uVar7;
    if (0x3fff < uVar7) {
      if (uVar7 == 0x7fff) {
        uVar4 = (uint)(ushort)pos[2] << 0x10;
        pUVar8 = pos + 3;
      }
      else {
        uVar4 = uVar7 * 0x10000 + 0xc0000000;
        pUVar8 = pUVar5;
      }
      uVar4 = (ushort)*pUVar8 | uVar4;
    }
    if (0x3fff < uVar7) {
      if (uVar7 == 0x7fff) {
        pUVar5 = pos + 4;
      }
      else {
        pUVar5 = pos + 3;
      }
    }
    if (pos[1] < L'\0') {
      if (haveUniqueValue == '\0') {
        *uniqueValue = uVar4;
        UVar6 = '\x01';
      }
      else {
        UVar6 = haveUniqueValue;
        if (uVar4 != *uniqueValue) goto LAB_002b8cc5;
      }
LAB_002b8ccd:
      bVar2 = true;
      haveUniqueValue = UVar6;
    }
    else {
      UVar3 = findUniqueValue(pUVar5 + (int)uVar4,haveUniqueValue,uniqueValue);
      UVar6 = '\x01';
      if (UVar3 != '\0') goto LAB_002b8ccd;
LAB_002b8cc5:
      bVar2 = false;
    }
    if (!bVar2) {
      return (UChar *)0x0;
    }
    iVar9 = iVar9 + -1;
    pos = pUVar5;
    if (iVar9 < 3) {
      return pUVar5 + 1;
    }
  } while( true );
}

Assistant:

const UChar *
UCharsTrie::findUniqueValueFromBranch(const UChar *pos, int32_t length,
                                      UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison unit
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node>>15);
        node&=0x7fff;
        int32_t value=readValue(pos, node);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison unit
}